

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O0

void helicsTranslatorSet(HelicsTranslator trans,char *prop,double val,HelicsError *err)

{
  Translator *pTVar1;
  HelicsError *in_RDX;
  long in_RSI;
  undefined8 in_XMM0_Qa;
  Translator *translator;
  HelicsError *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined8 local_30;
  
  pTVar1 = getTranslator(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (pTVar1 != (Translator *)0x0) {
    if (in_RSI == 0) {
      assignError(in_RDX,-4,"The supplied string argument is null and therefore invalid");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      (*(pTVar1->super_Interface)._vptr_Interface[5])(in_XMM0_Qa,pTVar1,local_38,local_30);
    }
  }
  return;
}

Assistant:

void helicsTranslatorSet(HelicsTranslator trans, const char* prop, double val, HelicsError* err)
{
    auto* translator = getTranslator(trans, err);
    if (translator == nullptr) {
        return;
    }
    CHECK_NULL_STRING(prop, void());
    try {
        translator->set(prop, val);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}